

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllTypes.cpp
# Opt level: O2

void __thiscall
slang::ast::FixedSizeUnpackedArrayType::serializeTo
          (FixedSizeUnpackedArrayType *this,ASTSerializer *serializer)

{
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_R9;
  string_view fmt;
  format_args args;
  string sStack_58;
  int32_t local_38 [4];
  int32_t local_28;
  
  ASTSerializer::write(serializer,0xb,"elementType",(size_t)this->elementType);
  local_38[0] = (this->range).left;
  local_28 = (this->range).right;
  fmt.size_ = 0x11;
  fmt.data_ = (char *)0x7;
  args.field_1.args_ = in_R9.args_;
  args.desc_ = (unsigned_long_long)local_38;
  ::fmt::v11::vformat_abi_cxx11_(&sStack_58,(v11 *)0x436cca,fmt,args);
  ASTSerializer::write(serializer,5,"range",(size_t)&sStack_58);
  std::__cxx11::string::~string((string *)&sStack_58);
  return;
}

Assistant:

void FixedSizeUnpackedArrayType::serializeTo(ASTSerializer& serializer) const {
    serializer.write("elementType", elementType);
    serializer.write("range", fmt::format("[{}:{}]", range.left, range.right));
}